

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_common.hpp
# Opt level: O3

void __thiscall
afsm::test::state_name::
on_enter<afsm::test::events::exec_prepared,afsm::inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>
          (state_name *this,exec_prepared *param_1,
          inner_state_machine<afsm::test::connection_pri_fsm_def::transaction,_afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          *param_2)

{
  long lVar1;
  ostream *poVar2;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  poVar2 = psst::operator<<((ostream *)&std::cerr,blue|bright);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x11;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,events::exec_prepared::name_abi_cxx11_,DAT_00441850);
  poVar2 = psst::operator<<(poVar2,clear);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": Enter ",8);
  (*this->_vptr_state_name[2])(&local_38,this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void
    on_enter(Event&&, FSM&)
    {
        using decayed_event = typename ::std::decay<Event>::type;
        using ::psst::ansi_color;
        ::std::cerr
             << (ansi_color::blue | ansi_color::bright)
             << ::std::setw(event_name_width) << ::std::left
             << decayed_event::name << ansi_color::clear
             << ": Enter " << name() << "\n";
    }